

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::count(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  byte bVar1;
  uint index;
  
  requireDStackDepth(this,1,"COUNT");
  requireDStackAvailable(this,1,"COUNT");
  this_00 = &this->dStack;
  index = ForthStack<unsigned_int>::getTop(this_00);
  bVar1 = dataSpaceAt(this,index);
  ForthStack<unsigned_int>::setTop(this_00,index + 1);
  ForthStack<unsigned_int>::push(this_00,(uint)bVar1);
  return;
}

Assistant:

void count() {
			REQUIRE_DSTACK_DEPTH(1, "COUNT");
			REQUIRE_DSTACK_AVAILABLE(1, "COUNT");
			auto caddr = CADDR(dStack.getTop());
			auto count = static_cast<Cell>(getDataChar(caddr));
			dStack.setTop(CELL(caddr + 1));
			push(count);
		}